

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001ecf40 = 0x2d2d2d2d2d2d2d;
    uRam00000000001ecf47._0_1_ = '-';
    uRam00000000001ecf47._1_1_ = '-';
    uRam00000000001ecf47._2_1_ = '-';
    uRam00000000001ecf47._3_1_ = '-';
    uRam00000000001ecf47._4_1_ = '-';
    uRam00000000001ecf47._5_1_ = '-';
    uRam00000000001ecf47._6_1_ = '-';
    uRam00000000001ecf47._7_1_ = '-';
    DAT_001ecf30 = '-';
    DAT_001ecf30_1._0_1_ = '-';
    DAT_001ecf30_1._1_1_ = '-';
    DAT_001ecf30_1._2_1_ = '-';
    DAT_001ecf30_1._3_1_ = '-';
    DAT_001ecf30_1._4_1_ = '-';
    DAT_001ecf30_1._5_1_ = '-';
    DAT_001ecf30_1._6_1_ = '-';
    uRam00000000001ecf38 = 0x2d2d2d2d2d2d2d;
    DAT_001ecf3f = 0x2d;
    DAT_001ecf20 = '-';
    DAT_001ecf20_1._0_1_ = '-';
    DAT_001ecf20_1._1_1_ = '-';
    DAT_001ecf20_1._2_1_ = '-';
    DAT_001ecf20_1._3_1_ = '-';
    DAT_001ecf20_1._4_1_ = '-';
    DAT_001ecf20_1._5_1_ = '-';
    DAT_001ecf20_1._6_1_ = '-';
    uRam00000000001ecf28._0_1_ = '-';
    uRam00000000001ecf28._1_1_ = '-';
    uRam00000000001ecf28._2_1_ = '-';
    uRam00000000001ecf28._3_1_ = '-';
    uRam00000000001ecf28._4_1_ = '-';
    uRam00000000001ecf28._5_1_ = '-';
    uRam00000000001ecf28._6_1_ = '-';
    uRam00000000001ecf28._7_1_ = '-';
    DAT_001ecf10 = '-';
    DAT_001ecf10_1._0_1_ = '-';
    DAT_001ecf10_1._1_1_ = '-';
    DAT_001ecf10_1._2_1_ = '-';
    DAT_001ecf10_1._3_1_ = '-';
    DAT_001ecf10_1._4_1_ = '-';
    DAT_001ecf10_1._5_1_ = '-';
    DAT_001ecf10_1._6_1_ = '-';
    uRam00000000001ecf18._0_1_ = '-';
    uRam00000000001ecf18._1_1_ = '-';
    uRam00000000001ecf18._2_1_ = '-';
    uRam00000000001ecf18._3_1_ = '-';
    uRam00000000001ecf18._4_1_ = '-';
    uRam00000000001ecf18._5_1_ = '-';
    uRam00000000001ecf18._6_1_ = '-';
    uRam00000000001ecf18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001ecf08._0_1_ = '-';
    uRam00000000001ecf08._1_1_ = '-';
    uRam00000000001ecf08._2_1_ = '-';
    uRam00000000001ecf08._3_1_ = '-';
    uRam00000000001ecf08._4_1_ = '-';
    uRam00000000001ecf08._5_1_ = '-';
    uRam00000000001ecf08._6_1_ = '-';
    uRam00000000001ecf08._7_1_ = '-';
    DAT_001ecf4f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}